

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

int Vec_VecSizeSize(Vec_Vec_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Vec_Ptr_t *vVec;
  Vec_Vec_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_VecSize(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pVVar2 = Vec_VecEntry(p,local_1c);
    local_20 = pVVar2->nSize + local_20;
  }
  return local_20;
}

Assistant:

static inline int Vec_VecSizeSize( Vec_Vec_t * p )
{
    Vec_Ptr_t * vVec;
    int i, Counter = 0;
    Vec_VecForEachLevel( p, vVec, i )
        Counter += vVec->nSize;
    return Counter;
}